

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase710::run(TestCase710 *this)

{
  long *plVar1;
  AsyncInputStream AVar2;
  PromiseBase PVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  __pid_t _Var8;
  undefined4 extraout_var;
  size_t sVar9;
  long extraout_RDX;
  long lVar10;
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  Fault f;
  ArrayBuilder<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> streams;
  CapabilityPipe pipe3;
  AsyncIoContext ioContext;
  CapabilityPipe pipe2;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> receiveStreams [3];
  CapabilityPipe pipe;
  char receiveBuffer [7];
  Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> result_1;
  ReadResult result;
  ArrayPtr<const_unsigned_char> secondBuf;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  AsyncInputStream local_270;
  undefined1 local_268 [40];
  bool local_240;
  bool local_238;
  PromiseBase local_228;
  size_t sStack_220;
  ArrayDisposer *pAStack_218;
  DebugExpression<kj::String> local_208;
  long local_1e8;
  long lStack_1e0;
  long local_1d8;
  undefined8 *local_1d0;
  long local_1c8 [2];
  undefined8 *local_1b8;
  long *local_1b0;
  undefined8 *local_1a8;
  long *local_1a0;
  undefined8 *local_198;
  long *local_190;
  void *local_188;
  long local_178 [4];
  undefined8 *local_158;
  long *plStack_150;
  undefined8 local_148;
  uint64_t uStack_140;
  long local_138 [3];
  long *local_120 [4];
  char local_100 [8];
  long *local_f8;
  undefined8 uStack_f0;
  undefined8 *local_e8;
  long local_d8;
  PromiseArenaMember local_d0;
  char *pcStack_c0;
  undefined8 local_b8;
  char *local_b0;
  char *pcStack_a8;
  undefined8 local_a0;
  char *local_98;
  char *pcStack_90;
  undefined8 local_88;
  char *local_80;
  char *pcStack_78;
  undefined8 local_70;
  char *local_68;
  char *pcStack_60;
  undefined8 local_58;
  char *local_50;
  char *pcStack_48;
  undefined8 local_40;
  undefined3 *local_38;
  undefined8 local_30;
  
  setupAsyncIo();
  (**(code **)(*local_190 + 0x10))(local_120);
  (**(code **)(*local_190 + 0x10))(local_178);
  (**(code **)(*local_190 + 0x10))(local_1c8);
  local_f8 = (long *)kj::_::HeapArrayDisposer::allocateImpl
                               (0x10,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_1d0 = &kj::_::HeapArrayDisposer::instance;
  *local_f8 = local_178[0];
  local_f8[1] = local_178[1];
  local_178[1] = 0;
  local_f8[2] = local_1c8[0];
  local_f8[3] = local_1c8[1];
  local_1c8[1] = 0;
  local_38 = &kj::_::ByteLiteral<4ul>;
  local_30 = 3;
  uStack_f0 = 2;
  local_e8 = &kj::_::HeapArrayDisposer::instance;
  local_1d8 = 0;
  local_1e8 = 0;
  lStack_1e0 = 0;
  (**(code **)(*local_120[1] + 0x80))
            (local_268,local_120[1],&kj::_::ByteLiteral<4ul>,3,&local_38,1,local_100 + 8);
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_48 = "run";
  local_40 = 0x3000002d2;
  uVar14 = 0x3000002d2;
  pcVar11 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcVar12 = "run";
  Promise<void>::wait((Promise<void> *)local_268,local_188);
  uVar15 = local_268._0_8_;
  if ((PromiseNode *)local_268._0_8_ != (PromiseNode *)0x0) {
    local_268._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar15);
  }
  uVar15 = uStack_f0;
  plVar1 = local_f8;
  if (local_f8 != (long *)0x0) {
    local_f8 = (long *)0x0;
    uStack_f0 = 0;
    (**(code **)*local_e8)
              (local_e8,plVar1,0x10,uVar15,uVar15,
               ArrayDisposer::Dispose_<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>::
               destruct,pcVar11,pcVar12,uVar14);
  }
  local_100[4] = '\0';
  local_100[5] = '\0';
  local_100[6] = 0;
  local_100[0] = '\0';
  local_100[1] = '\0';
  local_100[2] = '\0';
  local_100[3] = '\0';
  local_138[0] = 0;
  local_138[1] = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = (undefined8 *)0x0;
  plStack_150 = (long *)0x0;
  (**(code **)(*local_120[3] + 0x88))(local_268,local_120[3],local_100,6,7,&local_158,3);
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_60 = "run";
  local_58 = 0x11000002d7;
  _Var8 = Promise<kj::AsyncCapabilityStream::ReadResult>::wait
                    ((Promise<kj::AsyncCapabilityStream::ReadResult> *)local_268,local_188);
  uVar15 = local_268._0_8_;
  local_d8 = CONCAT44(extraout_var,_Var8);
  local_d0._vptr_PromiseArenaMember = (_func_int **)extraout_RDX;
  if ((OwnPromiseNode)local_268._0_8_ != (OwnPromiseNode)0x0) {
    local_268._0_8_ = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar15);
  }
  local_268._0_8_ = local_100 + 0x28;
  local_268[0x20] = local_d8 == 6;
  local_268._8_4_ = 6;
  local_268._16_8_ = " == ";
  local_268._24_8_ = &DAT_00000005;
  if ((!local_268[0x20]) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<unsigned_long&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x2da,ERROR,"\"failed: expected \" \"result.byteCount == 6\", _kjCondition",
               (char (*) [39])"failed: expected result.byteCount == 6",
               (DebugComparison<unsigned_long_&,_int> *)local_268);
  }
  local_100[6] = 0;
  sVar9 = strlen(local_100);
  local_208.value.content.size_ = sVar9 + 1;
  local_208.value.content.ptr = local_100;
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[7]> *)local_268,
             (DebugExpression<kj::StringPtr> *)&local_208,(char (*) [7])0x4f8dfd);
  if ((local_240 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::StringPtr,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x2dc,ERROR,
               "\"failed: expected \" \"kj::StringPtr(receiveBuffer) == \\\"foobar\\\"\", _kjCondition"
               ,(char (*) [58])"failed: expected kj::StringPtr(receiveBuffer) == \"foobar\"",
               (DebugComparison<kj::StringPtr,_const_char_(&)[7]> *)local_268);
  }
  local_268._0_8_ = local_100 + 0x30;
  local_268[0x20] = local_d0._vptr_PromiseArenaMember == (_func_int **)0x2;
  local_268._8_4_ = 2;
  local_268._16_8_ = " == ";
  local_268._24_8_ = &DAT_00000005;
  if (local_268[0x20]) {
    (**(code **)plStack_150[1])(local_268,plStack_150 + 1,&kj::_::ByteLiteral<4ul>,3);
    local_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
    ;
    pcStack_78 = "run";
    local_70 = 0x3000002e0;
    Promise<void>::wait((Promise<void> *)local_268,local_188);
    uVar15 = local_268._0_8_;
    if ((PromiseNode *)local_268._0_8_ != (PromiseNode *)0x0) {
      local_268._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar15);
    }
    plVar1 = plStack_150;
    if (plStack_150 != (long *)0x0) {
      plStack_150 = (long *)0x0;
      (**(code **)*local_158)(local_158,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    AsyncInputStream::readAllText(&local_270,local_178[3]);
    local_98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
    ;
    pcStack_90 = "run";
    local_88 = 0x4c000002e2;
    uVar15 = 0x4c000002e2;
    pcVar12 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
    ;
    pcVar13 = "run";
    Promise<kj::String>::wait((Promise<kj::String> *)&local_228,&local_270);
    local_208.value.content.ptr = (char *)local_228.node.ptr;
    local_208.value.content.size_ = sStack_220;
    local_208.value.content.disposer = pAStack_218;
    local_228.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    sStack_220 = 0;
    kj::_::DebugExpression<kj::String>::operator==
              ((DebugComparison<kj::String,_const_char_(&)[4]> *)local_268,&local_208,
               (char (*) [4])0x4c8534);
    sVar4 = local_208.value.content.size_;
    pcVar11 = local_208.value.content.ptr;
    if ((PromiseNode *)local_208.value.content.ptr != (PromiseNode *)0x0) {
      local_208.value.content.ptr = (char *)0x0;
      local_208.value.content.size_ = 0;
      (**(local_208.value.content.disposer)->_vptr_ArrayDisposer)
                (local_208.value.content.disposer,pcVar11,1,sVar4,sVar4,0,pcVar12,pcVar13,uVar15);
    }
    sVar4 = sStack_220;
    PVar3.node.ptr = local_228.node.ptr;
    if (local_228.node.ptr != (PromiseNode *)0x0) {
      local_228.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      sStack_220 = 0;
      (**pAStack_218->_vptr_ArrayDisposer)(pAStack_218,PVar3.node.ptr,1,sVar4,sVar4,0);
    }
    AVar2._vptr_AsyncInputStream = local_270._vptr_AsyncInputStream;
    if ((PromiseArenaMember *)local_270._vptr_AsyncInputStream != (PromiseArenaMember *)0x0) {
      local_270._vptr_AsyncInputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar2._vptr_AsyncInputStream);
    }
    if ((local_238 == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[81],kj::_::DebugComparison<kj::String,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x2e2,ERROR,
                 "\"failed: expected \" \"pipe2.ends[1]->readAllText().wait(ioContext.waitScope) == \\\"baz\\\"\", _kjCondition"
                 ,(char (*) [81])
                  "failed: expected pipe2.ends[1]->readAllText().wait(ioContext.waitScope) == \"baz\""
                 ,(DebugComparison<kj::String,_const_char_(&)[4]> *)local_268);
    }
    uVar14 = local_268._8_8_;
    uVar15 = local_268._0_8_;
    if ((PromiseNode *)local_268._0_8_ != (PromiseNode *)0x0) {
      local_268._0_8_ = (PromiseArenaMember *)0x0;
      local_268._8_8_ = 0;
      (***(_func_int ***)local_268._16_8_)(local_268._16_8_,uVar15,1,uVar14,uVar14,0);
    }
    (**(code **)local_1b0[1])(local_268,local_1b0 + 1,&kj::_::ByteLiteral<4ul>,3);
    local_b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
    ;
    pcStack_a8 = "run";
    local_a0 = 0x3000002e4;
    Promise<void>::wait((Promise<void> *)local_268,local_188);
    uVar15 = local_268._0_8_;
    if ((PromiseNode *)local_268._0_8_ != (PromiseNode *)0x0) {
      local_268._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar15);
    }
    plVar1 = local_1b0;
    if (local_1b0 != (long *)0x0) {
      local_1b0 = (long *)0x0;
      (**(code **)*local_1b8)(local_1b8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    AsyncInputStream::readAllText(&local_270,uStack_140);
    local_d0.arena = (PromiseArena *)0x4c27c0;
    pcStack_c0 = "run";
    local_b8 = 0x50000002e6;
    uVar15 = 0x50000002e6;
    pcVar12 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
    ;
    pcVar13 = "run";
    Promise<kj::String>::wait((Promise<kj::String> *)&local_228,&local_270);
    local_208.value.content.ptr = (char *)local_228.node.ptr;
    local_208.value.content.size_ = sStack_220;
    local_208.value.content.disposer = pAStack_218;
    local_228.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    sStack_220 = 0;
    kj::_::DebugExpression<kj::String>::operator==
              ((DebugComparison<kj::String,_const_char_(&)[4]> *)local_268,&local_208,
               (char (*) [4])0x4d1e88);
    sVar4 = local_208.value.content.size_;
    pcVar11 = local_208.value.content.ptr;
    if ((PromiseNode *)local_208.value.content.ptr != (PromiseNode *)0x0) {
      local_208.value.content.ptr = (char *)0x0;
      local_208.value.content.size_ = 0;
      (**(local_208.value.content.disposer)->_vptr_ArrayDisposer)
                (local_208.value.content.disposer,pcVar11,1,sVar4,sVar4,0,pcVar12,pcVar13,uVar15);
    }
    sVar4 = sStack_220;
    PVar3.node.ptr = local_228.node.ptr;
    if (local_228.node.ptr != (PromiseNode *)0x0) {
      local_228.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      sStack_220 = 0;
      (**pAStack_218->_vptr_ArrayDisposer)(pAStack_218,PVar3.node.ptr,1,sVar4,sVar4,0);
    }
    AVar2._vptr_AsyncInputStream = local_270._vptr_AsyncInputStream;
    if ((PromiseArenaMember *)local_270._vptr_AsyncInputStream != (PromiseArenaMember *)0x0) {
      local_270._vptr_AsyncInputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar2._vptr_AsyncInputStream);
    }
    if ((local_238 == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[85],kj::_::DebugComparison<kj::String,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x2e6,ERROR,
                 "\"failed: expected \" \"receiveStreams[1]->readAllText().wait(ioContext.waitScope) == \\\"qux\\\"\", _kjCondition"
                 ,(char (*) [85])
                  "failed: expected receiveStreams[1]->readAllText().wait(ioContext.waitScope) == \"qux\""
                 ,(DebugComparison<kj::String,_const_char_(&)[4]> *)local_268);
    }
    uVar14 = local_268._8_8_;
    uVar15 = local_268._0_8_;
    if ((PromiseNode *)local_268._0_8_ != (PromiseNode *)0x0) {
      local_268._0_8_ = (PromiseArenaMember *)0x0;
      local_268._8_8_ = 0;
      (***(_func_int ***)local_268._16_8_)(local_268._16_8_,uVar15,1,uVar14,uVar14,0);
    }
    lVar10 = 0;
    do {
      plVar1 = *(long **)((long)local_138 + lVar10 + 8);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)((long)local_138 + lVar10 + 8) = 0;
        (**(code **)**(undefined8 **)((long)local_138 + lVar10))
                  (*(undefined8 **)((long)local_138 + lVar10),
                   (long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      lVar7 = local_1d8;
      lVar6 = lStack_1e0;
      lVar5 = local_1e8;
      lVar10 = lVar10 + -0x10;
    } while (lVar10 != -0x30);
    if (local_1e8 != 0) {
      local_1e8 = 0;
      lStack_1e0 = 0;
      local_1d8 = 0;
      (**(code **)*local_1d0)
                (local_1d0,lVar5,0x10,lVar6 - lVar5 >> 4,lVar7 - lVar5 >> 4,
                 ArrayDisposer::Dispose_<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>::
                 destruct);
    }
    lVar10 = 0x10;
    do {
      plVar1 = *(long **)((long)local_1c8 + lVar10 + 8);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)((long)local_1c8 + lVar10 + 8) = 0;
        (**(code **)**(undefined8 **)((long)local_1c8 + lVar10))
                  (*(undefined8 **)((long)local_1c8 + lVar10),
                   (long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      lVar10 = lVar10 + -0x10;
    } while (lVar10 != -0x10);
    lVar10 = 0x10;
    do {
      plVar1 = *(long **)((long)local_178 + lVar10 + 8);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)((long)local_178 + lVar10 + 8) = 0;
        (**(code **)**(undefined8 **)((long)local_178 + lVar10))
                  (*(undefined8 **)((long)local_178 + lVar10),
                   (long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      lVar10 = lVar10 + -0x10;
    } while (lVar10 != -0x10);
    lVar10 = 0x10;
    do {
      plVar1 = *(long **)((long)local_120 + lVar10 + 8);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)((long)local_120 + lVar10 + 8) = 0;
        (**(code **)**(undefined8 **)((long)local_120 + lVar10))
                  (*(undefined8 **)((long)local_120 + lVar10),
                   (long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      plVar1 = local_190;
      lVar10 = lVar10 + -0x10;
    } while (lVar10 != -0x10);
    if (local_190 != (long *)0x0) {
      local_190 = (long *)0x0;
      (**(code **)*local_198)(local_198,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    plVar1 = local_1a0;
    if (local_1a0 != (long *)0x0) {
      local_1a0 = (long *)0x0;
      (**(code **)*local_1a8)(local_1a8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&>
            ((Fault *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,0x2de,FAILED,"result.capCount == 2","_kjCondition,",
             (DebugComparison<unsigned_long_&,_int> *)local_268);
  kj::_::Debug::Fault::fatal((Fault *)&local_208);
}

Assistant:

TEST(AsyncIo, CapabilityPipeMultiStreamMessage) {
  auto ioContext = setupAsyncIo();

  auto pipe = ioContext.provider->newCapabilityPipe();
  auto pipe2 = ioContext.provider->newCapabilityPipe();
  auto pipe3 = ioContext.provider->newCapabilityPipe();

  auto streams = heapArrayBuilder<Own<AsyncCapabilityStream>>(2);
  streams.add(kj::mv(pipe2.ends[0]));
  streams.add(kj::mv(pipe3.ends[0]));

  ArrayPtr<const byte> secondBuf = "bar"_kjb;
  pipe.ends[0]->writeWithStreams("foo"_kjb, arrayPtr(&secondBuf, 1), streams.finish())
      .wait(ioContext.waitScope);

  char receiveBuffer[7]{};
  Own<AsyncCapabilityStream> receiveStreams[3];
  auto result = pipe.ends[1]->tryReadWithStreams(receiveBuffer, 6, 7, receiveStreams, 3)
      .wait(ioContext.waitScope);

  KJ_EXPECT(result.byteCount == 6);
  receiveBuffer[6] = '\0';
  KJ_EXPECT(kj::StringPtr(receiveBuffer) == "foobar");

  KJ_ASSERT(result.capCount == 2);

  receiveStreams[0]->write("baz"_kjb).wait(ioContext.waitScope);
  receiveStreams[0] = nullptr;
  KJ_EXPECT(pipe2.ends[1]->readAllText().wait(ioContext.waitScope) == "baz");

  pipe3.ends[1]->write("qux"_kjb).wait(ioContext.waitScope);
  pipe3.ends[1] = nullptr;
  KJ_EXPECT(receiveStreams[1]->readAllText().wait(ioContext.waitScope) == "qux");
}